

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::sampleLevelArrayCubeSeamless
          (tcu *this,ConstPixelBufferAccess *(*faces) [6],int numLevels,CubeFace face,
          Sampler *sampler,float s,float t,int depth,float lod)

{
  int iVar1;
  int iVar2;
  float fVar3;
  undefined8 extraout_XMM0_Qa;
  ulong uVar4;
  Vector<float,_4> VVar5;
  Vec4 VVar6;
  ConstPixelBufferAccess *local_530;
  ConstPixelBufferAccess *local_518;
  ConstPixelBufferAccess *local_500;
  ConstPixelBufferAccess *local_4e8;
  FilterMode local_4d4;
  Vector<float,_4> local_4bc;
  Vector<float,_4> local_4ac;
  tcu local_49c [8];
  float local_494 [2];
  tcu local_48c [16];
  int local_47c;
  undefined1 local_478 [4];
  int i_2;
  ConstPixelBufferAccess faceAccesses1 [6];
  ConstPixelBufferAccess faceAccesses0 [6];
  tcu local_290 [8];
  float local_288 [2];
  tcu local_280 [16];
  undefined1 local_270 [8];
  Vec4 t1;
  Vec4 t0;
  float f;
  FilterMode levelFilter_1;
  int level1;
  int level0;
  int maxLevel_1;
  int i_1;
  ConstPixelBufferAccess faceAccesses_1 [6];
  FilterMode levelFilter;
  int level;
  int maxLevel;
  int i;
  ConstPixelBufferAccess faceAccesses [6];
  FilterMode filterMode;
  bool magnified;
  float lod_local;
  int depth_local;
  float t_local;
  float s_local;
  Sampler *sampler_local;
  CubeFace face_local;
  int numLevels_local;
  ConstPixelBufferAccess *(*faces_local) [6];
  undefined1 auVar7 [12];
  undefined8 uVar8;
  
  uVar4 = (ulong)(uint)lod;
  if (sampler->lodThreshold < lod) {
    local_4d4 = sampler->minFilter;
  }
  else {
    local_4d4 = sampler->magFilter;
  }
  switch(local_4d4) {
  case NEAREST:
    VVar5.m_data = (float  [4])sampleCubeSeamlessNearest(this,(*faces)[face],sampler,s,t,depth);
    break;
  case LINEAR:
    local_4e8 = (ConstPixelBufferAccess *)&maxLevel;
    do {
      ConstPixelBufferAccess::ConstPixelBufferAccess(local_4e8);
      local_4e8 = local_4e8 + 1;
    } while (local_4e8 != (ConstPixelBufferAccess *)&faceAccesses[5].m_data);
    for (level = 0; level < 6; level = level + 1) {
      memcpy(&maxLevel + (long)level * 10,(*faces)[level],0x28);
    }
    VVar5.m_data = (float  [4])
                   sampleCubeSeamlessLinear
                             (this,(ConstPixelBufferAccess (*) [6])&maxLevel,face,sampler,s,t,depth)
    ;
    break;
  case NEAREST_MIPMAP_NEAREST:
  case LINEAR_MIPMAP_NEAREST:
    fVar3 = deFloatCeil(lod + 0.5);
    faceAccesses_1[5].m_data._4_4_ = deClamp32((int)fVar3 + -1,0,numLevels + -1);
    faceAccesses_1[5].m_data._0_4_ = (uint)(local_4d4 == LINEAR_MIPMAP_NEAREST);
    if ((uint)faceAccesses_1[5].m_data == 0) {
      VVar5.m_data = (float  [4])
                     sampleCubeSeamlessNearest
                               (this,(*faces)[face] + faceAccesses_1[5].m_data._4_4_,sampler,s,t,
                                depth);
    }
    else {
      local_500 = (ConstPixelBufferAccess *)&maxLevel_1;
      do {
        ConstPixelBufferAccess::ConstPixelBufferAccess(local_500);
        local_500 = local_500 + 1;
      } while (local_500 != (ConstPixelBufferAccess *)&faceAccesses_1[5].m_data);
      for (level0 = 0; level0 < 6; level0 = level0 + 1) {
        memcpy(&maxLevel_1 + (long)level0 * 10,(*faces)[level0] + faceAccesses_1[5].m_data._4_4_,
               0x28);
      }
      VVar5.m_data = (float  [4])
                     sampleCubeSeamlessLinear
                               (this,(ConstPixelBufferAccess (*) [6])&maxLevel_1,face,sampler,s,t,
                                depth);
    }
    break;
  case NEAREST_MIPMAP_LINEAR:
  case LINEAR_MIPMAP_LINEAR:
    fVar3 = ::deFloatFloor(lod);
    iVar1 = deClamp32((int)fVar3,0,numLevels + -1);
    iVar2 = de::min<int>(numLevels + -1,iVar1 + 1);
    fVar3 = deFloatFrac(lod);
    Vector<float,_4>::Vector((Vector<float,_4> *)(t1.m_data + 2));
    Vector<float,_4>::Vector((Vector<float,_4> *)local_270);
    if (local_4d4 == LINEAR_MIPMAP_LINEAR) {
      local_518 = (ConstPixelBufferAccess *)&faceAccesses1[5].m_data;
      do {
        ConstPixelBufferAccess::ConstPixelBufferAccess(local_518);
        local_518 = local_518 + 1;
      } while (local_518 != (ConstPixelBufferAccess *)&faceAccesses0[5].m_data);
      local_530 = (ConstPixelBufferAccess *)local_478;
      do {
        ConstPixelBufferAccess::ConstPixelBufferAccess(local_530);
        local_530 = local_530 + 1;
      } while (local_530 != (ConstPixelBufferAccess *)&faceAccesses1[5].m_data);
      for (local_47c = 0; local_47c < 6; local_47c = local_47c + 1) {
        memcpy(&faceAccesses1[(long)local_47c + 5].m_data,(*faces)[local_47c] + iVar1,0x28);
        memcpy(local_478 + (long)local_47c * 0x28,(*faces)[local_47c] + iVar2,0x28);
      }
      sampleCubeSeamlessLinear
                (local_48c,(ConstPixelBufferAccess (*) [6])&faceAccesses1[5].m_data,face,sampler,s,t
                 ,depth);
      t1.m_data._8_8_ = local_48c._0_8_;
      sampleCubeSeamlessLinear
                (local_49c,(ConstPixelBufferAccess (*) [6])local_478,face,sampler,s,t,depth);
      local_270[0] = local_49c[0];
      local_270[1] = local_49c[1];
      local_270[2] = local_49c[2];
      local_270[3] = local_49c[3];
      local_270[4] = local_49c[4];
      local_270[5] = local_49c[5];
      local_270[6] = local_49c[6];
      local_270[7] = local_49c[7];
      t1.m_data[0] = local_494[0];
      t1.m_data[1] = local_494[1];
    }
    else {
      sampleCubeSeamlessNearest(local_280,(*faces)[face] + iVar1,sampler,s,t,depth);
      t1.m_data._8_8_ = local_280._0_8_;
      sampleCubeSeamlessNearest(local_290,(*faces)[face] + iVar2,sampler,s,t,depth);
      local_270[0] = local_290[0];
      local_270[1] = local_290[1];
      local_270[2] = local_290[2];
      local_270[3] = local_290[3];
      local_270[4] = local_290[4];
      local_270[5] = local_290[5];
      local_270[6] = local_290[6];
      local_270[7] = local_290[7];
      t1.m_data[0] = local_288[0];
      t1.m_data[1] = local_288[1];
    }
    operator*((tcu *)&local_4ac,(Vector<float,_4> *)(t1.m_data + 2),1.0 - fVar3);
    operator*((tcu *)&local_4bc,(Vector<float,_4> *)local_270,fVar3);
    VVar5 = operator+(this,&local_4ac,&local_4bc);
    break;
  default:
    Vector<float,_4>::Vector((Vector<float,_4> *)this,0.0);
    VVar5.m_data[2] = (float)(int)uVar4;
    VVar5.m_data[3] = (float)(int)(uVar4 >> 0x20);
    VVar5.m_data[0] = (float)(int)extraout_XMM0_Qa;
    VVar5.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  VVar6.m_data[0] = VVar5.m_data[0];
  auVar7._4_4_ = VVar5.m_data[1];
  register0x00001240 = VVar5.m_data[2];
  register0x00001244 = VVar5.m_data[3];
  return (Vec4)VVar6.m_data;
}

Assistant:

static Vec4 sampleLevelArrayCubeSeamless (const ConstPixelBufferAccess* const (&faces)[CUBEFACE_LAST], int numLevels, CubeFace face, const Sampler& sampler, float s, float t, int depth, float lod)
{
	bool					magnified	= lod <= sampler.lodThreshold;
	Sampler::FilterMode		filterMode	= magnified ? sampler.magFilter : sampler.minFilter;

	switch (filterMode)
	{
		case Sampler::NEAREST:
			return sampleCubeSeamlessNearest(faces[face][0], sampler, s, t, depth);

		case Sampler::LINEAR:
		{
			ConstPixelBufferAccess faceAccesses[CUBEFACE_LAST];
			for (int i = 0; i < (int)CUBEFACE_LAST; i++)
				faceAccesses[i] = faces[i][0];

			return sampleCubeSeamlessLinear(faceAccesses, face, sampler, s, t, depth);
		}

		case Sampler::NEAREST_MIPMAP_NEAREST:
		case Sampler::LINEAR_MIPMAP_NEAREST:
		{
			int						maxLevel	= (int)numLevels-1;
			int						level		= deClamp32((int)deFloatCeil(lod + 0.5f) - 1, 0, maxLevel);
			Sampler::FilterMode		levelFilter	= (filterMode == Sampler::LINEAR_MIPMAP_NEAREST) ? Sampler::LINEAR : Sampler::NEAREST;

			if (levelFilter == Sampler::NEAREST)
				return sampleCubeSeamlessNearest(faces[face][level], sampler, s, t, depth);
			else
			{
				DE_ASSERT(levelFilter == Sampler::LINEAR);

				ConstPixelBufferAccess faceAccesses[CUBEFACE_LAST];
				for (int i = 0; i < (int)CUBEFACE_LAST; i++)
					faceAccesses[i] = faces[i][level];

				return sampleCubeSeamlessLinear(faceAccesses, face, sampler, s, t, depth);
			}
		}

		case Sampler::NEAREST_MIPMAP_LINEAR:
		case Sampler::LINEAR_MIPMAP_LINEAR:
		{
			int						maxLevel	= (int)numLevels-1;
			int						level0		= deClamp32((int)deFloatFloor(lod), 0, maxLevel);
			int						level1		= de::min(maxLevel, level0 + 1);
			Sampler::FilterMode		levelFilter	= (filterMode == Sampler::LINEAR_MIPMAP_LINEAR) ? Sampler::LINEAR : Sampler::NEAREST;
			float					f			= deFloatFrac(lod);
			Vec4					t0;
			Vec4					t1;

			if (levelFilter == Sampler::NEAREST)
			{
				t0 = sampleCubeSeamlessNearest(faces[face][level0], sampler, s, t, depth);
				t1 = sampleCubeSeamlessNearest(faces[face][level1], sampler, s, t, depth);
			}
			else
			{
				DE_ASSERT(levelFilter == Sampler::LINEAR);

				ConstPixelBufferAccess faceAccesses0[CUBEFACE_LAST];
				ConstPixelBufferAccess faceAccesses1[CUBEFACE_LAST];
				for (int i = 0; i < (int)CUBEFACE_LAST; i++)
				{
					faceAccesses0[i] = faces[i][level0];
					faceAccesses1[i] = faces[i][level1];
				}

				t0 = sampleCubeSeamlessLinear(faceAccesses0, face, sampler, s, t, depth);
				t1 = sampleCubeSeamlessLinear(faceAccesses1, face, sampler, s, t, depth);
			}

			return t0*(1.0f - f) + t1*f;
		}

		default:
			DE_ASSERT(DE_FALSE);
			return Vec4(0.0f);
	}
}